

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O1

uint8_t * __thiscall
google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback
          (EpsCopyOutputStream *this,uint8_t *ptr)

{
  LogMessage *pLVar1;
  uint8_t *puVar2;
  int iVar3;
  LogFinisher local_a1;
  LogMessage local_a0;
  LogMessage local_68;
  
  do {
    if (this->had_error_ == true) {
      return this->buffer_;
    }
    iVar3 = (int)ptr - (int)this->end_;
    if (iVar3 < 0) {
      internal::LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/io/coded_stream.cc"
                 ,0x33d);
      pLVar1 = internal::LogMessage::operator<<(&local_68,"CHECK failed: overrun >= 0: ");
      internal::LogFinisher::operator=(&local_a1,pLVar1);
      internal::LogMessage::~LogMessage(&local_68);
    }
    if (0x10 < iVar3) {
      internal::LogMessage::LogMessage
                (&local_a0,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/io/coded_stream.cc"
                 ,0x33e);
      pLVar1 = internal::LogMessage::operator<<(&local_a0,"CHECK failed: overrun <= kSlopBytes: ");
      internal::LogFinisher::operator=(&local_a1,pLVar1);
      internal::LogMessage::~LogMessage(&local_a0);
    }
    puVar2 = Next(this);
    ptr = puVar2 + iVar3;
  } while (this->end_ <= ptr);
  return ptr;
}

Assistant:

uint8_t* EpsCopyOutputStream::EnsureSpaceFallback(uint8_t* ptr) {
  do {
    if (PROTOBUF_PREDICT_FALSE(had_error_)) return buffer_;
    int overrun = ptr - end_;
    GOOGLE_DCHECK(overrun >= 0);           // NOLINT
    GOOGLE_DCHECK(overrun <= kSlopBytes);  // NOLINT
    ptr = Next() + overrun;
  } while (ptr >= end_);
  GOOGLE_DCHECK(ptr < end_);  // NOLINT
  return ptr;
}